

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

bool llb_buildsystem_command_interface_spawn
               (llb_task_interface_t ti,llb_buildsystem_queue_job_context_t *job_context,char **args
               ,int32_t arg_count,char **env_keys,char **env_values,int32_t env_count,
               llb_data_t *working_dir,llb_buildsystem_spawn_delegate_t *delegate)

{
  _func_void *__s;
  char *__s_00;
  ProcessAttributes attributes;
  pointer ppVar1;
  pointer pSVar2;
  size_t sVar3;
  ProcessDelegate *delegate_00;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  ArrayRef<llvm::StringRef> commandLine;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment;
  _Any_data local_120;
  code *local_110;
  code *local_108;
  llb_buildsystem_queue_job_context_t *local_f8;
  char **local_f0;
  undefined2 local_e8;
  undefined6 uStack_e6;
  uint8_t *puStack_e0;
  uint64_t local_d8;
  undefined2 uStack_d0;
  undefined6 uStack_ce;
  future<llbuild::basic::ProcessResult> result;
  llb_task_interface_t ti_local;
  _Vector_base<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
  local_a8;
  _Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_88;
  promise<llbuild::basic::ProcessResult> p;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> local_58;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  uVar5 = 0;
  uVar7 = (ulong)(uint)arg_count;
  if (arg_count < 1) {
    uVar7 = uVar5;
  }
  local_88._M_impl.super__Vector_impl_data._M_start = (StringRef *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8 = job_context;
  local_f0 = env_keys;
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    local_120._M_unused._M_object = args[uVar5];
    if ((_func_void *)local_120._M_unused._0_8_ == (_func_void *)0x0) {
      local_120._8_8_ = 0;
    }
    else {
      local_120._8_8_ = strlen((char *)local_120._M_unused._0_8_);
    }
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_88,
               (StringRef *)&local_120);
  }
  uVar5 = 0;
  uVar7 = (ulong)(uint)env_count;
  if (env_count < 1) {
    uVar7 = uVar5;
  }
  local_a8._M_impl.super__Vector_impl_data._M_start = (pair<llvm::StringRef,_llvm::StringRef> *)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    __s = (_func_void *)local_f0[uVar5];
    if (__s == (_func_void *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = strlen((char *)__s);
    }
    __s_00 = env_values[uVar5];
    if (__s_00 == (char *)0x0) {
      local_108 = (code *)0x0;
    }
    else {
      local_108 = (code *)strlen(__s_00);
    }
    local_120._M_unused._M_object = __s;
    local_120._8_8_ = sVar3;
    local_110 = (code *)__s_00;
    std::
    vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
    ::emplace_back<std::pair<llvm::StringRef,llvm::StringRef>>
              ((vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                *)&local_a8,(pair<llvm::StringRef,_llvm::StringRef> *)&local_120);
  }
  std::promise<llbuild::basic::ProcessResult>::promise(&p);
  std::__basic_future<llbuild::basic::ProcessResult>::__basic_future
            (&result.super___basic_future<llbuild::basic::ProcessResult>,&p._M_future);
  delegate_00 = (ProcessDelegate *)operator_new(0x10);
  pSVar2 = local_88._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = local_a8._M_impl.super__Vector_impl_data._M_start;
  delegate_00->_vptr_ProcessDelegate = (_func_int **)&PTR__ProcessDelegate_0022c2c0;
  delegate_00[1]._vptr_ProcessDelegate = (_func_int **)delegate;
  lVar6 = (long)local_88._M_impl.super__Vector_impl_data._M_finish -
          (long)local_88._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
          (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  local_e8 = 1;
  local_d8 = working_dir->length;
  puStack_e0 = working_dir->data;
  uStack_d0 = 0x101;
  local_120._8_8_ = 0;
  local_120._M_unused._M_object = &p;
  local_108 = std::
              _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1400:30)>
              ::_M_invoke;
  local_110 = std::
              _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1400:30)>
              ::_M_manager;
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::OptionalStorage(&local_58,(function<void_(llbuild::basic::ProcessResult)> *)&local_120);
  attributes._2_6_ = uStack_e6;
  attributes.canSafelyInterrupt = (bool)(undefined1)local_e8;
  attributes.connectToConsole = (bool)local_e8._1_1_;
  attributes._26_6_ = uStack_ce;
  attributes.inheritEnvironment = (bool)(undefined1)uStack_d0;
  attributes.controlEnabled = (bool)uStack_d0._1_1_;
  attributes.workingDir.Data = (char *)puStack_e0;
  attributes.workingDir.Length = local_d8;
  commandLine.Length = lVar6 >> 4;
  commandLine.Data = pSVar2;
  environment.Length = lVar4 >> 5;
  environment.Data = ppVar1;
  llbuild::core::TaskInterface::spawn
            ((TaskInterface *)&ti_local,(QueueJobContext *)local_f8,commandLine,environment,
             attributes,(Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)&local_58,
             delegate_00);
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::reset(&local_58);
  if (local_110 != (code *)0x0) {
    (*local_110)(&local_120,&local_120,__destroy_functor);
  }
  (*delegate_00->_vptr_ProcessDelegate[1])(delegate_00);
  std::future<llbuild::basic::ProcessResult>::get((ProcessResult *)&local_120,&result);
  bVar8 = local_120._0_4_ == 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&result.super___basic_future<llbuild::basic::ProcessResult>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<llbuild::basic::ProcessResult>::~promise(&p);
  std::
  _Vector_base<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
  ::~_Vector_base(&local_a8);
  std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base(&local_88);
  return bVar8;
}

Assistant:

bool llb_buildsystem_command_interface_spawn(llb_task_interface_t ti, llb_buildsystem_queue_job_context_t *job_context, const char * const*args, int32_t arg_count, const char * const *env_keys, const char * const *env_values, int32_t env_count, llb_data_t *working_dir, llb_buildsystem_spawn_delegate_t *delegate) {
  auto coreti = reinterpret_cast<core::TaskInterface*>(&ti);
  auto arguments = std::vector<StringRef>();
  for (int32_t i = 0; i < arg_count; i++) {
    arguments.push_back(StringRef(args[i]));
  }
  auto environment = std::vector<std::pair<StringRef, StringRef>>();
  for (int32_t i = 0; i < env_count; i++) {
    environment.push_back(std::pair<StringRef, StringRef>(StringRef(env_keys[i]), StringRef(env_values[i])));
  }
  
  std::promise<ProcessResult> p;
  auto result = p.get_future();
  auto commandCompletionFn = [&p](ProcessResult processResult) mutable {
    p.set_value(processResult);
  };
  
  class ForwardingProcessDelegate: public basic::ProcessDelegate {
    llb_buildsystem_spawn_delegate_t *delegate;
    
  public:
    ForwardingProcessDelegate(llb_buildsystem_spawn_delegate_t *delegate): delegate(delegate) {}
    
    virtual void processStarted(ProcessContext* ctx, ProcessHandle handle,
                                llbuild_pid_t pid) {
      if (delegate != NULL) {
        delegate->process_started(delegate->context, pid);
      }
    }

    virtual void processHadError(ProcessContext* ctx, ProcessHandle handle,
                                 const Twine& message) {
      if (delegate != NULL) {
        auto errStr = message.str();
        llb_data_t err{ errStr.size(), (const uint8_t*) errStr.data() };
        delegate->process_had_error(delegate->context, &err);
      }
    };

    virtual void processHadOutput(ProcessContext* ctx, ProcessHandle handle,
                                  StringRef data) {
      if (delegate != NULL) {
        llb_data_t message{ data.size(), (const uint8_t*) data.data() };
        delegate->process_had_output(delegate->context, &message);
      }
    };

    virtual void processFinished(ProcessContext* ctx, ProcessHandle handle,
                                 const ProcessResult& result) {
      if (delegate != NULL) {
        llb_buildsystem_command_extended_result_t res;
        res.result = get_command_result(result.status);
        res.exit_status = result.exitCode;
        res.pid = result.pid;
        res.utime = result.utime;
        res.stime = result.stime;
        res.maxrss = result.maxrss;
        delegate->process_finished(delegate->context, &res);
      }
    }

  };

  auto forwardingDelegate = new ForwardingProcessDelegate(delegate);
  coreti->spawn((QueueJobContext*)job_context, ArrayRef<StringRef>(arguments), ArrayRef<std::pair<StringRef, StringRef>>(environment), {true, false, StringRef((const char*)working_dir->data, working_dir->length)}, {commandCompletionFn}, forwardingDelegate);

  delete forwardingDelegate;

  return result.get().status == ProcessStatus::Succeeded;  
}